

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O2

llama_sampler * llama_sampler_init_mirostat_v2(uint32_t seed,float tau,float eta)

{
  uint32_t uVar1;
  uint32_t *ctx;
  llama_sampler *plVar2;
  
  uVar1 = get_rng_seed(seed);
  ctx = (uint32_t *)operator_new(0x13a0);
  *ctx = seed;
  ctx[1] = uVar1;
  ctx[2] = (uint32_t)tau;
  ctx[3] = (uint32_t)eta;
  ctx[4] = (uint32_t)(tau + tau);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          *)(ctx + 6),(ulong)uVar1);
  plVar2 = llama_sampler_init(&llama_sampler_mirostat_v2_i,ctx);
  return plVar2;
}

Assistant:

struct llama_sampler * llama_sampler_init_mirostat_v2(uint32_t seed, float tau, float eta) {
    auto seed_cur = get_rng_seed(seed);
    return llama_sampler_init(
        /* .iface = */ &llama_sampler_mirostat_v2_i,
        /* .ctx   = */ new llama_sampler_mirostat_v2 {
            /* .seed     = */ seed,
            /* .seed_cur = */ seed_cur,
            /* .tau      = */ tau,
            /* .eta      = */ eta,
            /* .mu       = */ 2.0f*tau,
            /* .rng      = */ std::mt19937(seed_cur),
        }
    );
}